

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O1

bool __thiscall
QColorDialogPrivate::handleColorPickingMouseButtonRelease(QColorDialogPrivate *this,QMouseEvent *e)

{
  undefined4 uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  QColorDialogPrivate *this_00;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar5 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar6 [16];
  QColor QVar7;
  QPoint local_28;
  QColor local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QColorDialogPrivate **)(e + 0x30);
  uVar1 = QEventPoint::globalPosition();
  auVar6._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                 extraout_XMM1_Qa;
  auVar6._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                 extraout_XMM0_Qa;
  auVar6 = minpd(_DAT_0066f5d0,auVar6);
  auVar5._8_8_ = -(ulong)(-2147483648.0 < auVar6._8_8_);
  auVar5._0_8_ = -(ulong)(-2147483648.0 < auVar6._0_8_);
  uVar2 = movmskpd(uVar1,auVar5);
  uVar4 = 0x8000000000000000;
  if ((uVar2 & 1) != 0) {
    uVar4 = (ulong)(uint)(int)auVar6._0_8_ << 0x20;
  }
  uVar3 = 0x80000000;
  if ((uVar2 & 2) != 0) {
    uVar3 = (ulong)(uint)(int)auVar6._8_8_;
  }
  local_28 = (QPoint)(uVar3 | uVar4);
  QVar7 = grabScreenColor(this_00,&local_28);
  local_20._0_8_ = QVar7._0_8_;
  local_20.ct._4_4_ = QVar7.ct._4_4_;
  local_20.ct.argb.pad = QVar7.ct._8_2_;
  setCurrentColor(this,&local_20,SetColorAll);
  releaseColorPicking(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool QColorDialogPrivate::handleColorPickingMouseButtonRelease(QMouseEvent *e)
{
    setCurrentColor(grabScreenColor(e->globalPosition().toPoint()), SetColorAll);
    releaseColorPicking();
    return true;
}